

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall
NavierStokesBase::errorEst
          (NavierStokesBase *this,TagBoxArray *tb,int param_2,int param_3,Real param_4,int param_5,
          int param_6)

{
  bool bVar1;
  EBFArrayBoxFactory *this_00;
  
  this_00 = (EBFArrayBoxFactory *)
            __dynamic_cast((this->super_AmrLevel).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (this_00 == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  bVar1 = amrex::EBFArrayBoxFactory::isAllRegular(this_00);
  if (!bVar1) {
    if (refine_cutcells == 0) {
      amrex::Abort_host("For now, cutcells must always exist at finest level.");
    }
    if (refine_cutcells != 0) {
      amrex::TagCutCells(tb,(MultiFab *)
                            (((this->super_AmrLevel).state.
                              super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                              super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                              ._M_impl.super__Vector_impl_data._M_start)->new_data)._M_t.
                            super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        );
      return;
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::errorEst (TagBoxArray& tb,
                            int          /*clearval*/,
                            int          /*tagval*/,
                            Real         /*time*/,
                            int          /*n_error_buf*/,
                            int          /*ngrow*/)
{
#ifdef AMREX_USE_EB
    // Enforce that the EB not cross the coarse-fine boundary
    const auto& ebfactory = dynamic_cast<amrex::EBFArrayBoxFactory const&>(Factory());
    if ( !ebfactory.isAllRegular() )
    {
        //
        // FIXME - For now, always refine cut cells
        //   Later, figure out a slick way to check if EB and CFB cross
        //   and allow !refine_cutcells
        //
        if (!refine_cutcells) {
            amrex::Abort("For now, cutcells must always exist at finest level.");
        }

        // Refine on cut cells
        if (refine_cutcells)
        {
            const MultiFab& S_new = get_new_data(State_Type);
            amrex::TagCutCells(tb, S_new);
        }
    }
#else
    amrex::ignore_unused(tb);
#endif
}